

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  ulong uVar1;
  long in_RSI;
  long in_RDI;
  Option opt_q;
  Mat weight_data_int8;
  Mat weight_data_r2;
  int num_input;
  int maxk;
  Allocator *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  Mat *in_stack_fffffffffffffe38;
  void *__ptr;
  int *piVar2;
  void *local_178;
  int *local_170;
  long *local_158;
  undefined4 local_130;
  int local_12c;
  int local_114;
  undefined1 *local_110;
  undefined1 *local_f8;
  void **local_e8;
  undefined1 *local_b8;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  int local_70;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined1 *local_8;
  
  if (*(int *)(in_RDI + 0x158) == 0) {
    if ((((*(byte *)(in_RSI + 0x1e) & 1) == 0) || (*(long *)(in_RDI + 0x170) != 4)) ||
       (*(int *)(in_RDI + 0x108) == 0)) {
      local_114 = 0;
    }
    else {
      local_12c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
      uVar1 = (long)*(int *)(in_RDI + 0x104) / (long)*(int *)(in_RDI + 0xd0);
      local_130 = (undefined4)
                  ((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                  (long)local_12c);
      Mat::reshape(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                   in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
      local_110 = &stack0xfffffffffffffe40;
      __ptr = (void *)0x0;
      piVar2 = (int *)0x0;
      quantize_to_int8((Mat *)0x0,(Mat *)0x0,(Mat *)0x0,(Option *)in_stack_fffffffffffffe38);
      local_b8 = &stack0xfffffffffffffe40;
      if (__ptr != (void *)0x0) {
        local_8 = local_b8;
      }
      local_114 = -100;
      local_f8 = &stack0xfffffffffffffe40;
      local_68 = local_f8;
      if (piVar2 != (int *)0x0) {
        local_6c = 0xffffffff;
        LOCK();
        local_70 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((local_70 == 1) && (__ptr != (void *)0x0)) {
          free(__ptr);
        }
      }
      local_e8 = &local_178;
      if (local_170 != (int *)0x0) {
        local_8c = 0xffffffff;
        LOCK();
        local_90 = *local_170;
        *local_170 = *local_170 + -1;
        UNLOCK();
        if (local_90 == 1) {
          local_88 = local_e8;
          if (local_158 == (long *)0x0) {
            if (local_178 != (void *)0x0) {
              free(local_178);
            }
          }
          else {
            (**(code **)(*local_158 + 0x18))(local_158,local_178);
          }
        }
      }
    }
  }
  else {
    local_114 = 0;
  }
  return local_114;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int maxk = kernel_w * kernel_h;
        const int num_input = weight_data_size / num_output / maxk;

        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        Mat weight_data_int8;

        Option opt_q = opt;
        opt_q.blob_allocator = weight_data.allocator;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#else
    (void)(opt);
#endif // NCNN_INT8

    return 0;
}